

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryExtensionRange_Test::TestBody
          (ValidationErrorTest_MapEntryExtensionRange_Test *this)

{
  DescriptorProto *pDVar1;
  Message *in_RCX;
  string_view input;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  basic_string_view<char,_std::char_traits<char>_> local_128 [2];
  undefined1 local_108 [8];
  FileDescriptorProto file_proto;
  ValidationErrorTest_MapEntryExtensionRange_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_108);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_128,"extension_range {   start: 10 end: 20 } ");
  pDVar1 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_108,0);
  pDVar1 = DescriptorProto::mutable_nested_type(pDVar1,0);
  input._M_str = (char *)pDVar1;
  input._M_len = (size_t)local_128[0]._M_str;
  TextFormat::MergeFromString((TextFormat *)local_128[0]._M_len,input,in_RCX);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_140,descriptor_unittest::(anonymous_namespace)::kMapEntryErrorMessage);
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_108,&local_140);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_140);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryExtensionRange) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  TextFormat::MergeFromString(
      "extension_range { "
      "  start: 10 end: 20 "
      "} ",
      file_proto.mutable_message_type(0)->mutable_nested_type(0));
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}